

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

int LZ4_compress_HC_extStateHC_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int compressionLevel)

{
  int iVar1;
  int local_34;
  
  iVar1 = 0;
  if (((ulong)state & 7) == 0) {
    local_34 = srcSize;
    LZ4_resetStreamHC_fast((LZ4_streamHC_t *)state,compressionLevel);
    LZ4HC_init_internal((LZ4HC_CCtx_internal *)state,(BYTE *)src);
    iVar1 = LZ4_compressBound(srcSize);
    iVar1 = LZ4HC_compress_generic
                      ((LZ4HC_CCtx_internal *)state,src,dst,&local_34,dstCapacity,compressionLevel,
                       (uint)(dstCapacity < iVar1));
  }
  return iVar1;
}

Assistant:

int LZ4_compress_HC_extStateHC_fastReset (void* state, const char* src, char* dst, int srcSize, int dstCapacity, int compressionLevel)
{
    LZ4HC_CCtx_internal* const ctx = &((LZ4_streamHC_t*)state)->internal_donotuse;
    if (!LZ4_isAligned(state, LZ4_streamHC_t_alignment())) return 0;
    LZ4_resetStreamHC_fast((LZ4_streamHC_t*)state, compressionLevel);
    LZ4HC_init_internal (ctx, (const BYTE*)src);
    if (dstCapacity < LZ4_compressBound(srcSize))
        return LZ4HC_compress_generic (ctx, src, dst, &srcSize, dstCapacity, compressionLevel, limitedOutput);
    else
        return LZ4HC_compress_generic (ctx, src, dst, &srcSize, dstCapacity, compressionLevel, notLimited);
}